

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O0

int yaml_document_start_event_initialize
              (yaml_event_t *event,yaml_version_directive_t *version_directive,
              yaml_tag_directive_t *tag_directives_start,yaml_tag_directive_t *tag_directives_end,
              int implicit)

{
  yaml_tag_directive_t *pyVar1;
  yaml_char_t *pyVar2;
  int iVar3;
  size_t sVar4;
  yaml_tag_directive_t value_1;
  yaml_tag_directive_t *tag_directive;
  yaml_tag_directive_t value;
  anon_struct_24_3_654a3493 tag_directives_copy;
  yaml_version_directive_t *version_directive_copy;
  yaml_mark_t mark;
  anon_struct_4_1_a7dec128 context;
  int implicit_local;
  yaml_tag_directive_t *tag_directives_end_local;
  yaml_tag_directive_t *tag_directives_start_local;
  yaml_version_directive_t *version_directive_local;
  yaml_event_t *event_local;
  
  mark.column._4_4_ = implicit;
  memset(&version_directive_copy,0,0x18);
  tag_directives_copy.top = (yaml_tag_directive_t *)0x0;
  memset(&value.prefix,0,0x18);
  memset(&tag_directive,0,0x10);
  if (event == (yaml_event_t *)0x0) {
    __assert_fail("event",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                  ,0x2d0,
                  "int yaml_document_start_event_initialize(yaml_event_t *, yaml_version_directive_t *, yaml_tag_directive_t *, yaml_tag_directive_t *, int)"
                 );
  }
  if (((tag_directives_start == (yaml_tag_directive_t *)0x0) ||
      (tag_directives_end == (yaml_tag_directive_t *)0x0)) &&
     (tag_directives_start != tag_directives_end)) {
    __assert_fail("(tag_directives_start && tag_directives_end) || (tag_directives_start == tag_directives_end)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                  ,0x2d2,
                  "int yaml_document_start_event_initialize(yaml_event_t *, yaml_version_directive_t *, yaml_tag_directive_t *, yaml_tag_directive_t *, int)"
                 );
  }
  if (version_directive == (yaml_version_directive_t *)0x0) {
LAB_00105553:
    if (tag_directives_start != tag_directives_end) {
      value.prefix = (yaml_char_t *)yaml_malloc(0x100);
      if ((yaml_tag_directive_t *)value.prefix == (yaml_tag_directive_t *)0x0) {
        mark.column._0_4_ = 1;
        goto LAB_001057bd;
      }
      tag_directives_copy.start = (yaml_tag_directive_t *)((long)value.prefix + 0x100);
      tag_directives_copy.end = (yaml_tag_directive_t *)value.prefix;
      for (value_1.prefix = (yaml_char_t *)tag_directives_start;
          (yaml_tag_directive_t *)value_1.prefix != tag_directives_end;
          value_1.prefix = value_1.prefix + 0x10) {
        if (*(long *)value_1.prefix == 0) {
          __assert_fail("tag_directive->handle",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                        ,0x2e2,
                        "int yaml_document_start_event_initialize(yaml_event_t *, yaml_version_directive_t *, yaml_tag_directive_t *, yaml_tag_directive_t *, int)"
                       );
        }
        if (*(long *)(value_1.prefix + 8) == 0) {
          __assert_fail("tag_directive->prefix",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                        ,0x2e3,
                        "int yaml_document_start_event_initialize(yaml_event_t *, yaml_version_directive_t *, yaml_tag_directive_t *, yaml_tag_directive_t *, int)"
                       );
        }
        pyVar2 = *(yaml_char_t **)value_1.prefix;
        sVar4 = strlen(*(char **)value_1.prefix);
        iVar3 = yaml_check_utf8(pyVar2,sVar4);
        if (iVar3 == 0) goto LAB_001057bd;
        pyVar2 = *(yaml_char_t **)(value_1.prefix + 8);
        sVar4 = strlen(*(char **)(value_1.prefix + 8));
        iVar3 = yaml_check_utf8(pyVar2,sVar4);
        if (iVar3 == 0) goto LAB_001057bd;
        tag_directive = (yaml_tag_directive_t *)yaml_strdup(*(yaml_char_t **)value_1.prefix);
        value.handle = yaml_strdup(*(yaml_char_t **)(value_1.prefix + 8));
        if ((tag_directive == (yaml_tag_directive_t *)0x0) || (value.handle == (yaml_char_t *)0x0))
        goto LAB_001057bd;
        if ((tag_directives_copy.end == tag_directives_copy.start) &&
           (iVar3 = yaml_stack_extend(&value.prefix,&tag_directives_copy.end,
                                      &tag_directives_copy.start), iVar3 == 0)) {
          mark.column._0_4_ = 1;
          goto LAB_001057bd;
        }
        (tag_directives_copy.end)->handle = (yaml_char_t *)tag_directive;
        (tag_directives_copy.end)->prefix = value.handle;
        tag_directive = (yaml_tag_directive_t *)0x0;
        value.handle = (yaml_char_t *)0x0;
        tag_directives_copy.end = tag_directives_copy.end + 1;
      }
    }
    memset(event,0,0x68);
    event->type = YAML_DOCUMENT_START_EVENT;
    (event->start_mark).index = (size_t)version_directive_copy;
    (event->start_mark).line = mark.index;
    (event->start_mark).column = mark.line;
    (event->end_mark).index = (size_t)version_directive_copy;
    (event->end_mark).line = mark.index;
    (event->end_mark).column = mark.line;
    (event->data).document_start.version_directive =
         (yaml_version_directive_t *)tag_directives_copy.top;
    (event->data).scalar.tag = value.prefix;
    (event->data).document_start.tag_directives.end = tag_directives_copy.end;
    (event->data).document_start.implicit = mark.column._4_4_;
    event_local._4_4_ = 1;
  }
  else {
    tag_directives_copy.top = (yaml_tag_directive_t *)yaml_malloc(8);
    if (tag_directives_copy.top != (yaml_tag_directive_t *)0x0) {
      *(int *)&(tag_directives_copy.top)->handle = version_directive->major;
      *(int *)((long)&(tag_directives_copy.top)->handle + 4) = version_directive->minor;
      goto LAB_00105553;
    }
LAB_001057bd:
    yaml_free(tag_directives_copy.top);
    while ((yaml_tag_directive_t *)value.prefix != tag_directives_copy.end) {
      pyVar1 = tag_directives_copy.end + -1;
      pyVar2 = tag_directives_copy.end[-1].prefix;
      tag_directives_copy.end = tag_directives_copy.end + -1;
      yaml_free(pyVar1->handle);
      yaml_free(pyVar2);
    }
    yaml_free(value.prefix);
    tag_directives_copy.start = (yaml_tag_directive_t *)0x0;
    tag_directives_copy.end = (yaml_tag_directive_t *)0x0;
    value.prefix = (yaml_char_t *)0x0;
    yaml_free(tag_directive);
    yaml_free(value.handle);
    event_local._4_4_ = 0;
  }
  return event_local._4_4_;
}

Assistant:

YAML_DECLARE(int)
yaml_document_start_event_initialize(yaml_event_t *event,
        yaml_version_directive_t *version_directive,
        yaml_tag_directive_t *tag_directives_start,
        yaml_tag_directive_t *tag_directives_end,
        int implicit)
{
    struct {
        yaml_error_type_t error;
    } context;
    yaml_mark_t mark = { 0, 0, 0 };
    yaml_version_directive_t *version_directive_copy = NULL;
    struct {
        yaml_tag_directive_t *start;
        yaml_tag_directive_t *end;
        yaml_tag_directive_t *top;
    } tag_directives_copy = { NULL, NULL, NULL };
    yaml_tag_directive_t value = { NULL, NULL };

    assert(event);          /* Non-NULL event object is expected. */
    assert((tag_directives_start && tag_directives_end) ||
            (tag_directives_start == tag_directives_end));
                            /* Valid tag directives are expected. */

    if (version_directive) {
        version_directive_copy = YAML_MALLOC_STATIC(yaml_version_directive_t);
        if (!version_directive_copy) goto error;
        version_directive_copy->major = version_directive->major;
        version_directive_copy->minor = version_directive->minor;
    }

    if (tag_directives_start != tag_directives_end) {
        yaml_tag_directive_t *tag_directive;
        if (!STACK_INIT(&context, tag_directives_copy, yaml_tag_directive_t*))
            goto error;
        for (tag_directive = tag_directives_start;
                tag_directive != tag_directives_end; tag_directive ++) {
            assert(tag_directive->handle);
            assert(tag_directive->prefix);
            if (!yaml_check_utf8(tag_directive->handle,
                        strlen((char *)tag_directive->handle)))
                goto error;
            if (!yaml_check_utf8(tag_directive->prefix,
                        strlen((char *)tag_directive->prefix)))
                goto error;
            value.handle = yaml_strdup(tag_directive->handle);
            value.prefix = yaml_strdup(tag_directive->prefix);
            if (!value.handle || !value.prefix) goto error;
            if (!PUSH(&context, tag_directives_copy, value))
                goto error;
            value.handle = NULL;
            value.prefix = NULL;
        }
    }

    DOCUMENT_START_EVENT_INIT(*event, version_directive_copy,
            tag_directives_copy.start, tag_directives_copy.top,
            implicit, mark, mark);

    return 1;

error:
    yaml_free(version_directive_copy);
    while (!STACK_EMPTY(context, tag_directives_copy)) {
        yaml_tag_directive_t value = POP(context, tag_directives_copy);
        yaml_free(value.handle);
        yaml_free(value.prefix);
    }
    STACK_DEL(context, tag_directives_copy);
    yaml_free(value.handle);
    yaml_free(value.prefix);

    return 0;
}